

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall
lts2::LBDOperator::drawBasis
          (LBDOperator *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *basisFunctions,int normalize
          )

{
  _InputArray *p_Var1;
  ulong uVar2;
  long lVar3;
  Mat negPart;
  _InputArray local_f0;
  _InputArray local_d8;
  int local_bc;
  LBDOperator *local_b8;
  ulong local_b0;
  _OutputArray local_a8;
  Mat local_90 [96];
  
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
            (basisFunctions,(ulong)*(uint *)&(this->super_LinearOperator).field_0xc);
  cv::Mat::Mat(local_90);
  if (*(int *)&(this->super_LinearOperator).field_0xc != 0) {
    lVar3 = 0;
    uVar2 = 0;
    local_bc = normalize;
    local_b8 = this;
    do {
      fillBasisFunctionForIndex
                (this,(basisFunctions->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start + lVar3,(int)uVar2);
      if (0 < normalize) {
        local_f0.obj = (basisFunctions->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar3;
        local_f0.sz.width = 0;
        local_f0.sz.height = 0;
        local_f0.flags = 0x1010000;
        local_d8.sz.width = 0;
        local_d8.sz.height = 0;
        local_d8.flags = 0x2010000;
        local_d8.obj = local_90;
        local_b0 = uVar2;
        cv::threshold(&local_f0,(_OutputArray *)&local_d8,-1.1754943508222875e-38,-1.0,1);
        local_f0.obj = (basisFunctions->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar3;
        local_f0.sz.width = 0;
        local_f0.sz.height = 0;
        local_f0.flags = 0x1010000;
        local_d8.sz.width = 0;
        local_d8.sz.height = 0;
        local_d8.flags = 0x2010000;
        local_d8.obj = local_f0.obj;
        cv::threshold(&local_f0,(_OutputArray *)&local_d8,1.1754943508222875e-38,1.0,0);
        local_f0.obj = (basisFunctions->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar3;
        local_f0.sz.width = 0;
        local_f0.sz.height = 0;
        local_f0.flags = 0x1010000;
        local_d8.sz.width = 0;
        local_d8.sz.height = 0;
        local_d8.flags = 0x1010000;
        local_d8.obj = local_90;
        local_a8.super__InputArray.sz.width = 0;
        local_a8.super__InputArray.sz.height = 0;
        local_a8.super__InputArray.flags = -0x3dff0000;
        local_a8.super__InputArray.obj = local_f0.obj;
        p_Var1 = (_InputArray *)cv::noArray();
        uVar2 = local_b0;
        this = local_b8;
        normalize = local_bc;
        cv::add(&local_f0,&local_d8,&local_a8,p_Var1,-1);
      }
      if (normalize != 0) {
        local_f0.obj = (basisFunctions->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar3;
        local_f0.sz.width = 0;
        local_f0.sz.height = 0;
        local_f0.flags = 0x1010000;
        local_d8.sz.width = 0;
        local_d8.sz.height = 0;
        local_d8.flags = 0x3010000;
        local_d8.obj = local_f0.obj;
        p_Var1 = (_InputArray *)cv::noArray();
        cv::normalize(&local_f0,(_InputOutputArray *)&local_d8,0.0,1.0,0x20,-1,p_Var1);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x60;
    } while (uVar2 < *(uint *)&(this->super_LinearOperator).field_0xc);
  }
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void lts2::LBDOperator::drawBasis(std::vector<cv::Mat> &basisFunctions, int normalize) const
{
  basisFunctions.resize(_pairsInUse);
  cv::Mat negPart;

  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(basisFunctions[i], i);

    if (normalize > 0) {
      cv::threshold(basisFunctions[i], negPart, -FLT_MIN, -1.0, cv::THRESH_BINARY_INV);
      cv::threshold(basisFunctions[i], basisFunctions[i], FLT_MIN, 1.0, cv::THRESH_BINARY);
      basisFunctions[i] += negPart;
    }
    if (normalize != 0) cv::normalize(basisFunctions[i], basisFunctions[i], 0.0, 1.0, cv::NORM_MINMAX);
  }
}